

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O3

void Ssc_GiaClassesInit(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Rpr_t *pGVar2;
  int *piVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __nmemb;
  bool bVar8;
  bool bVar9;
  
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                  ,0x10d,"void Ssc_GiaClassesInit(Gia_Man_t *)");
  }
  __nmemb = (size_t)p->nObjs;
  pGVar2 = (Gia_Rpr_t *)calloc(__nmemb,4);
  p->pReprs = pGVar2;
  piVar3 = (int *)calloc(__nmemb,4);
  p->pNexts = piVar3;
  if (0 < (long)__nmemb) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = *(uint *)(&p->pObjs->field_0x0 + lVar4);
      bVar8 = (~uVar1 & 0x1fffffff) != 0;
      bVar9 = (~uVar1 & 0x9fffffff) == 0;
      uVar7 = 0;
      if (!bVar9 && (!bVar8 || -1 >= (int)uVar1)) {
        uVar7 = 0xfffffff;
      }
      if (uVar6 <= uVar7 && (bVar9 || bVar8 && -1 < (int)uVar1)) {
        __assert_fail("Num == GIA_VOID || Num < Id",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x3a2,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
      }
      p->pReprs[uVar6] = (Gia_Rpr_t)((uint)p->pReprs[uVar6] & 0xf0000000 | (uint)uVar7);
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0xc;
    } while ((long)uVar6 < (long)p->nObjs);
  }
  if (p->vClassOld == (Vec_Int_t *)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    piVar3 = (int *)malloc(400);
    pVVar5->pArray = piVar3;
    p->vClassOld = pVVar5;
  }
  if (p->vClassNew == (Vec_Int_t *)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    piVar3 = (int *)malloc(400);
    pVVar5->pArray = piVar3;
    p->vClassNew = pVVar5;
  }
  return;
}

Assistant:

void Ssc_GiaClassesInit( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    p->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Gia_ObjSetRepr( p, i, Gia_ObjIsCand(pObj) ? 0 : GIA_VOID );
    if ( p->vClassOld == NULL )
        p->vClassOld = Vec_IntAlloc( 100 );
    if ( p->vClassNew == NULL )
        p->vClassNew = Vec_IntAlloc( 100 );
}